

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void utilOnExitRun(void)

{
  size_t sVar1;
  size_t pos;
  ulong local_8;
  
  sVar1 = blobSize(_fns);
  local_8 = sVar1 >> 3;
  while (local_8 != 0) {
    (*_fns[local_8 - 1])();
    local_8 = local_8 - 1;
  }
  blobClose((blob_t)0x11f508);
  _fns = (util_onexit_t *)0x0;
  mtMtxClose((mt_mtx_t *)0x11f51f);
  return;
}

Assistant:

static void utilOnExitRun(void)
{
	size_t pos;
	// pre
	ASSERT(blobIsValid(_fns));
	ASSERT(blobSize(_fns) % sizeof(util_onexit_t) == 0);
	// вызвать зарегистрированные функции
	for (pos = blobSize(_fns) / sizeof(util_onexit_t); pos--;)
		_fns[pos]();
	// закрыть список функций
	blobClose(_fns), _fns = 0;
	// закрыть мьютекс
	mtMtxClose(_mtx);
}